

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::converter::DataPiece::DecodeBase64
          (DataPiece *this,StringPiece src,string *dest)

{
  protobuf *this_00;
  bool bVar1;
  int iVar2;
  stringpiece_ssize_type sVar3;
  string *dest_00;
  char *pcVar4;
  undefined1 __s1 [8];
  _Alloc_hider __n;
  StringPiece SVar5;
  StringPiece src_00;
  StringPiece src_01;
  StringPiece local_b8;
  undefined1 local_a0 [8];
  string encoded;
  string *local_78;
  undefined1 local_70 [16];
  undefined1 *local_60;
  string *local_58;
  undefined1 local_50 [16];
  undefined1 auStack_40 [8];
  StringPiece src_local;
  
  src_local.ptr_ = (char *)src.length_;
  auStack_40 = (undefined1  [8])src.ptr_;
  SVar5.length_ = (stringpiece_ssize_type)dest;
  SVar5.ptr_ = src_local.ptr_;
  dest_00 = dest;
  bVar1 = WebSafeBase64Unescape((protobuf *)auStack_40,SVar5,dest);
  if (bVar1) {
    if (this->use_strict_base64_decoding_ != true) {
      return true;
    }
    local_a0 = (undefined1  [8])&encoded._M_string_length;
    encoded._M_dataplus._M_p = (pointer)0x0;
    encoded._M_string_length._0_1_ = 0;
    this_00 = (protobuf *)(dest->_M_dataplus)._M_p;
    pcVar4 = (char *)dest->_M_string_length;
    if ((long)pcVar4 < 0) {
      StringPiece::LogFatalSizeTooBig((size_t)pcVar4,"size_t to int conversion");
    }
    src_00.length_ = (stringpiece_ssize_type)local_a0;
    src_00.ptr_ = pcVar4;
    WebSafeBase64Escape(this_00,src_00,dest_00);
    local_b8.ptr_._0_4_ = auStack_40._0_4_;
    local_b8.ptr_._4_4_ = auStack_40._4_4_;
    local_b8.length_._0_4_ = src_local.ptr_._0_4_;
    local_b8.length_._4_4_ = src_local.ptr_._4_4_;
    local_60 = local_50;
    if (auStack_40 == (undefined1  [8])0x0) {
      local_58 = (string *)0x0;
      local_50[0] = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,auStack_40,src_local.ptr_ + (long)auStack_40);
    }
    encoded.field_2._8_8_ = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)((long)&encoded.field_2 + 8),"=","");
    pcVar4 = src_local.ptr_;
    if ((local_78 <= local_58) &&
       (iVar2 = std::__cxx11::string::compare
                          ((ulong)&local_60,(long)local_58 - (long)local_78,local_78),
       pcVar4 = src_local.ptr_, iVar2 == 0)) {
      sVar3 = StringPiece::find_last_not_of((StringPiece *)auStack_40,'=',0xffffffffffffffff);
      pcVar4 = (char *)(sVar3 + 1);
    }
    SVar5 = StringPiece::substr(&local_b8,0,(size_type)pcVar4);
    if ((undefined1 *)encoded.field_2._8_8_ != local_70) {
      operator_delete((void *)encoded.field_2._8_8_);
    }
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
    __n._M_p = encoded._M_dataplus._M_p;
    __s1 = local_a0;
    if ((long)encoded._M_dataplus._M_p < 0) {
      StringPiece::LogFatalSizeTooBig((size_t)encoded._M_dataplus._M_p,"size_t to int conversion");
    }
  }
  else {
    src_01.length_ = (stringpiece_ssize_type)dest;
    src_01.ptr_ = src_local.ptr_;
    bVar1 = Base64Unescape((protobuf *)auStack_40,src_01,dest_00);
    if (!bVar1) {
      return false;
    }
    if (this->use_strict_base64_decoding_ != true) {
      return true;
    }
    local_a0 = (undefined1  [8])&encoded._M_string_length;
    encoded._M_dataplus._M_p = (pointer)0x0;
    encoded._M_string_length._0_1_ = 0;
    Base64Escape((uchar *)(dest->_M_dataplus)._M_p,(int)dest->_M_string_length,(string *)local_a0,
                 false);
    local_b8.ptr_._0_4_ = auStack_40._0_4_;
    local_b8.ptr_._4_4_ = auStack_40._4_4_;
    local_b8.length_._0_4_ = src_local.ptr_._0_4_;
    local_b8.length_._4_4_ = src_local.ptr_._4_4_;
    local_60 = local_50;
    if (auStack_40 == (undefined1  [8])0x0) {
      local_58 = (string *)0x0;
      local_50[0] = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,auStack_40,src_local.ptr_ + (long)auStack_40);
    }
    encoded.field_2._8_8_ = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)((long)&encoded.field_2 + 8),"=","");
    pcVar4 = src_local.ptr_;
    if ((local_78 <= local_58) &&
       (iVar2 = std::__cxx11::string::compare
                          ((ulong)&local_60,(long)local_58 - (long)local_78,local_78),
       pcVar4 = src_local.ptr_, iVar2 == 0)) {
      sVar3 = StringPiece::find_last_not_of((StringPiece *)auStack_40,'=',0xffffffffffffffff);
      pcVar4 = (char *)(sVar3 + 1);
    }
    SVar5 = StringPiece::substr(&local_b8,0,(size_type)pcVar4);
    if ((undefined1 *)encoded.field_2._8_8_ != local_70) {
      operator_delete((void *)encoded.field_2._8_8_);
    }
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
    __n._M_p = encoded._M_dataplus._M_p;
    __s1 = local_a0;
    if ((long)encoded._M_dataplus._M_p < 0) {
      StringPiece::LogFatalSizeTooBig((size_t)encoded._M_dataplus._M_p,"size_t to int conversion");
    }
  }
  if (__n._M_p == (pointer)SVar5.length_) {
    bVar1 = true;
    if (0 < (long)__n._M_p && __s1 != (undefined1  [8])SVar5.ptr_) {
      iVar2 = bcmp((void *)__s1,SVar5.ptr_,(size_t)__n._M_p);
      bVar1 = iVar2 == 0;
    }
  }
  else {
    bVar1 = false;
  }
  if (local_a0 != (undefined1  [8])&encoded._M_string_length) {
    operator_delete((void *)local_a0);
  }
  return bVar1;
}

Assistant:

bool DataPiece::DecodeBase64(StringPiece src, std::string* dest) const {
  // Try web-safe decode first, if it fails, try the non-web-safe decode.
  if (WebSafeBase64Unescape(src, dest)) {
    if (use_strict_base64_decoding_) {
      // In strict mode, check if the escaped version gives us the same value as
      // unescaped.
      std::string encoded;
      // WebSafeBase64Escape does no padding by default.
      WebSafeBase64Escape(*dest, &encoded);
      // Remove trailing padding '=' characters before comparison.
      StringPiece src_no_padding = StringPiece(src).substr(
          0, HasSuffixString(src, "=") ? src.find_last_not_of('=') + 1
                                      : src.length());
      return encoded == src_no_padding;
    }
    return true;
  }

  if (Base64Unescape(src, dest)) {
    if (use_strict_base64_decoding_) {
      std::string encoded;
      Base64Escape(reinterpret_cast<const unsigned char*>(dest->data()),
                         dest->length(), &encoded, false);
      StringPiece src_no_padding = StringPiece(src).substr(
          0, HasSuffixString(src, "=") ? src.find_last_not_of('=') + 1
                                      : src.length());
      return encoded == src_no_padding;
    }
    return true;
  }

  return false;
}